

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * rbuObjIterGetBindlist(sqlite3rbu *p,int nBind)

{
  char *pcVar1;
  ulong uVar2;
  char cVar3;
  
  pcVar1 = (char *)rbuMalloc(p,(long)nBind * 2 + 1);
  if (0 < nBind && pcVar1 != (char *)0x0) {
    uVar2 = 0;
    do {
      pcVar1[uVar2 * 2] = '?';
      cVar3 = ',';
      if ((ulong)(uint)nBind - 1 == uVar2) {
        cVar3 = '\0';
      }
      pcVar1[uVar2 * 2 + 1] = cVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)nBind != uVar2);
  }
  return pcVar1;
}

Assistant:

static char *rbuObjIterGetBindlist(sqlite3rbu *p, int nBind){
  char *zRet = 0;
  sqlite3_int64 nByte = 2*(sqlite3_int64)nBind + 1;

  zRet = (char*)rbuMalloc(p, nByte);
  if( zRet ){
    int i;
    for(i=0; i<nBind; i++){
      zRet[i*2] = '?';
      zRet[i*2+1] = (i+1==nBind) ? '\0' : ',';
    }
  }
  return zRet;
}